

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XML256TableTranscoder.cpp
# Opt level: O2

XMLSize_t __thiscall
xercesc_4_0::XML256TableTranscoder::transcodeFrom
          (XML256TableTranscoder *this,XMLByte *srcData,XMLSize_t srcCount,XMLCh *toFill,
          XMLSize_t maxChars,XMLSize_t *bytesEaten,uchar *charSizes)

{
  byte *pbVar1;
  byte bVar2;
  XMLCh *pXVar3;
  
  if (srcCount < maxChars) {
    maxChars = srcCount;
  }
  pbVar1 = srcData + maxChars;
  pXVar3 = this->fFromTable;
  while (srcData < pbVar1) {
    bVar2 = *srcData;
    srcData = srcData + 1;
    if (pXVar3[bVar2] != L'\xffff') {
      *toFill = pXVar3[bVar2];
      toFill = toFill + 1;
    }
  }
  *bytesEaten = maxChars;
  memset(charSizes,1,maxChars);
  return maxChars;
}

Assistant:

XMLSize_t
XML256TableTranscoder::transcodeFrom(const  XMLByte* const       srcData
                                    , const XMLSize_t            srcCount
                                    ,       XMLCh* const         toFill
                                    , const XMLSize_t            maxChars
                                    ,       XMLSize_t&           bytesEaten
                                    ,       unsigned char* const charSizes)
{
    //
    //  Calculate the max chars we can do here. Its the lesser of the
    //  max output chars and the number of chars in the source.
    //
    const XMLSize_t countToDo = srcCount < maxChars ? srcCount : maxChars;

    //
    //  Loop through the count we have to do and map each char via the
    //  lookup table.
    //
    const XMLByte*  srcPtr = srcData;
    const XMLByte*  endPtr = (srcPtr + countToDo);
    XMLCh*          outPtr = toFill;
    while (srcPtr < endPtr)
    {
        const XMLCh uniCh = fFromTable[*srcPtr++];
        if (uniCh != 0xFFFF)
        {
            *outPtr++ = uniCh;
            continue;
        }
    }


    // Set the bytes eaten
    bytesEaten = countToDo;

    // Set the character sizes to the fixed size
    memset(charSizes, 1, countToDo);

    // Return the chars we transcoded
    return countToDo;
}